

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

float ImGui::TableGetHeaderRowHeight(void)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  char *text;
  ImGuiStyle *pIVar5;
  int column_n;
  int iVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar7 [64];
  int iVar8;
  undefined1 local_28 [16];
  undefined1 extraout_var [56];
  
  local_28._0_4_ = GetTextLineHeight();
  local_28._4_4_ = extraout_XMM0_Db;
  local_28._8_4_ = extraout_XMM0_Dc;
  local_28._12_4_ = extraout_XMM0_Dd;
  if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = GImGui->CurrentTable->ColumnsCount;
  }
  if (0 < iVar6) {
    column_n = 0;
    do {
      uVar4 = TableGetColumnFlags(column_n);
      if ((uVar4 & 0x1001000) == 0x1000000) {
        text = TableGetColumnName(column_n);
        auVar7._0_8_ = CalcTextSize(text,(char *)0x0,false,-1.0);
        auVar7._8_56_ = extraout_var;
        auVar1 = vmovshdup_avx(auVar7._0_16_);
        uVar2 = vcmpss_avx512f(auVar1,local_28,2);
        bVar3 = (bool)((byte)uVar2 & 1);
        iVar8 = local_28._0_4_;
        local_28._4_12_ = auVar1._4_12_;
        local_28._0_4_ = (uint)bVar3 * iVar8 + (uint)!bVar3 * auVar1._0_4_;
      }
      column_n = column_n + 1;
    } while (iVar6 != column_n);
  }
  pIVar5 = GetStyle();
  auVar1 = vfmadd132ss_fma(ZEXT416((uint)(pIVar5->CellPadding).y),local_28,ZEXT416(0x40000000));
  return auVar1._0_4_;
}

Assistant:

float ImGui::TableGetHeaderRowHeight()
{
    // Caring for a minor edge case:
    // Calculate row height, for the unlikely case that some labels may be taller than others.
    // If we didn't do that, uneven header height would highlight but smaller one before the tallest wouldn't catch input for all height.
    // In your custom header row you may omit this all together and just call TableNextRow() without a height...
    float row_height = GetTextLineHeight();
    int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
    {
        ImGuiTableColumnFlags flags = TableGetColumnFlags(column_n);
        if ((flags & ImGuiTableColumnFlags_IsEnabled) && !(flags & ImGuiTableColumnFlags_NoHeaderLabel))
            row_height = ImMax(row_height, CalcTextSize(TableGetColumnName(column_n)).y);
    }
    row_height += GetStyle().CellPadding.y * 2.0f;
    return row_height;
}